

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O3

void argon2_choose_passes
               (Argon2Flavour flavour,uint32_t mem,uint32_t milliseconds,uint32_t *passes,
               uint32_t parallel,uint32_t taglen,ptrlen P,ptrlen S,ptrlen K,ptrlen X,strbuf *out)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  uint passes_00;
  uint uVar3;
  uint uVar4;
  
  uVar4 = 1;
  passes_00 = 1;
  while( true ) {
    uVar1 = getticks();
    argon2(flavour,mem,passes_00,parallel,taglen,P,S,K,X,out);
    uVar2 = getticks();
    uVar3 = uVar4 + passes_00;
    if (((ulong)(milliseconds * 1000) / 1000 <= uVar2 - uVar1) || (CARRY4(uVar4,passes_00))) break;
    strbuf_shrink_to(out,0);
    uVar4 = passes_00;
    passes_00 = uVar3;
  }
  *passes = passes_00;
  return;
}

Assistant:

void argon2_choose_passes(
    Argon2Flavour flavour, uint32_t mem,
    uint32_t milliseconds, uint32_t *passes,
    uint32_t parallel, uint32_t taglen,
    ptrlen P, ptrlen S, ptrlen K, ptrlen X,
    strbuf *out)
{
    unsigned long desired_time = (TICKSPERSEC * milliseconds) / 1000;

    /*
     * We only need the time taken to be approximately right, so we
     * scale up the number of passes geometrically, which avoids
     * taking O(t^2) time to find a pass count taking time t.
     *
     * Using the Fibonacci numbers is slightly nicer than the obvious
     * approach of powers of 2, because it's still very easy to
     * compute, and grows less fast (powers of 1.6 instead of 2), so
     * you get just a touch more precision.
     */
    uint32_t a = 1, b = 1;

    while (true) {
        unsigned long start_time = GETTICKCOUNT();
        argon2(flavour, mem, b, parallel, taglen, P, S, K, X, out);
        unsigned long ticks = GETTICKCOUNT() - start_time;

        /* But just in case computers get _too_ fast, we have to cap
         * the growth before it gets past the uint32_t upper bound! So
         * if computing a+b would overflow, stop here. */

        if (ticks >= desired_time || a > (uint32_t)~b) {
            *passes = b;
            return;
        } else {
            strbuf_clear(out);

            /* Next Fibonacci number: replace (a, b) with (b, a+b) */
            b += a;
            a = b - a;
        }
    }
}